

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_core.hpp
# Opt level: O1

bool __thiscall iutest::UnitTest::Failed(UnitTest *this)

{
  pointer ppTVar1;
  bool bVar2;
  bool bVar3;
  pointer ppTVar4;
  
  bVar2 = TestResult::Failed(&(this->super_UnitTestImpl).m_ad_hoc_testresult);
  if (bVar2) {
    bVar2 = false;
  }
  else {
    ppTVar4 = (this->super_UnitTestImpl).m_testsuites.
              super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppTVar1 = (this->super_UnitTestImpl).m_testsuites.
              super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    bVar2 = ppTVar4 == ppTVar1;
    if ((!bVar2) && (bVar3 = TestSuite::Passed(*ppTVar4), bVar3)) {
      do {
        ppTVar4 = ppTVar4 + 1;
        bVar2 = ppTVar4 == ppTVar1;
        if (bVar2) break;
        bVar3 = TestSuite::Passed(*ppTVar4);
      } while (bVar3);
    }
  }
  return (bool)(bVar2 ^ 1);
}

Assistant:

bool            Failed()            const { return !Passed(); }